

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

void av1_inv_txfm2d_add_16x64_c(int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long in_RDI;
  int txfm_buf [1152];
  int col;
  int32_t mod_input [1024];
  TX_SIZE in_stack_ffffffffffffddee;
  TX_TYPE in_stack_ffffffffffffddef;
  int32_t *in_stack_ffffffffffffddf0;
  int in_stack_ffffffffffffddfc;
  uint16_t *in_stack_ffffffffffffde00;
  int32_t *in_stack_ffffffffffffde08;
  int in_stack_ffffffffffffde18;
  int local_1054;
  undefined1 local_1050 [128];
  undefined1 auStack_fd0 [3992];
  long local_38;
  
  local_38 = in_RDI;
  for (local_1054 = 0; local_1054 < 0x10; local_1054 = local_1054 + 1) {
    memcpy(local_1050 + (long)(local_1054 << 6) * 4,(void *)(local_38 + (long)(local_1054 << 5) * 4)
           ,0x80);
    memset(auStack_fd0 + (long)(local_1054 << 6) * 4,0,0x80);
  }
  inv_txfm2d_add_facade
            (in_stack_ffffffffffffde08,in_stack_ffffffffffffde00,in_stack_ffffffffffffddfc,
             in_stack_ffffffffffffddf0,in_stack_ffffffffffffddef,in_stack_ffffffffffffddee,
             in_stack_ffffffffffffde18);
  return;
}

Assistant:

void av1_inv_txfm2d_add_16x64_c(const int32_t *input, uint16_t *output,
                                int stride, TX_TYPE tx_type, int bd) {
  // Remap 16x32 input into a modified 16x64 input by:
  // - Copying over these values in top-left 16x32 locations.
  // - Setting the rest of the locations to 0.
  int32_t mod_input[64 * 16];
  for (int col = 0; col < 16; ++col) {
    memcpy(mod_input + col * 64, input + col * 32, 32 * sizeof(*mod_input));
    memset(mod_input + col * 64 + 32, 0, 32 * sizeof(*mod_input));
  }
  DECLARE_ALIGNED(32, int, txfm_buf[16 * 64 + 64 + 64]);
  inv_txfm2d_add_facade(mod_input, output, stride, txfm_buf, tx_type, TX_16X64,
                        bd);
}